

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStateUpdatePdu.cpp
# Opt level: O2

void __thiscall
DIS::EntityStateUpdatePdu::unmarshal(EntityStateUpdatePdu *this,DataStream *dataStream)

{
  ulong uVar1;
  VariableParameter x;
  VariableParameter VStack_48;
  
  EntityInformationFamilyPdu::unmarshal(&this->super_EntityInformationFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_entityID,dataStream);
  DataStream::operator>>(dataStream,&this->_padding1);
  DataStream::operator>>(dataStream,&this->_numberOfVariableParameters);
  Vector3Float::unmarshal(&this->_entityLinearVelocity,dataStream);
  Vector3Double::unmarshal(&this->_entityLocation,dataStream);
  EulerAngles::unmarshal(&this->_entityOrientation,dataStream);
  DataStream::operator>>(dataStream,&this->_entityAppearance);
  std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::clear
            (&this->_variableParameters);
  for (uVar1 = 0; uVar1 < this->_numberOfVariableParameters; uVar1 = uVar1 + 1) {
    VariableParameter::VariableParameter(&VStack_48);
    VariableParameter::unmarshal(&VStack_48,dataStream);
    std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::push_back
              (&this->_variableParameters,&VStack_48);
    VariableParameter::~VariableParameter(&VStack_48);
  }
  return;
}

Assistant:

void EntityStateUpdatePdu::unmarshal(DataStream& dataStream)
{
    EntityInformationFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _entityID.unmarshal(dataStream);
    dataStream >> _padding1;
    dataStream >> _numberOfVariableParameters;
    _entityLinearVelocity.unmarshal(dataStream);
    _entityLocation.unmarshal(dataStream);
    _entityOrientation.unmarshal(dataStream);
    dataStream >> _entityAppearance;

     _variableParameters.clear();
     for(size_t idx = 0; idx < _numberOfVariableParameters; idx++)
     {
        VariableParameter x;
        x.unmarshal(dataStream);
        _variableParameters.push_back(x);
     }
}